

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O3

HT_ErrorCode ht_timeline_set_feature(HT_Timeline *timeline,HT_Feature *feature)

{
  HT_FeatureKlass *pHVar1;
  ulong uVar2;
  HT_ErrorCode HVar3;
  
  if (feature == (HT_Feature *)0x0) {
    __assert_fail("feature",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                  ,0x7b,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
  }
  pHVar1 = feature->klass;
  if (pHVar1 != (HT_FeatureKlass *)0x0) {
    uVar2 = (ulong)pHVar1->id;
    HVar3 = HT_ERR_FEATURE_NOT_REGISTERED;
    if ((uVar2 < 0x20) &&
       (HVar3 = HT_ERR_FEATURE_ALREADY_REGISTERED, timeline->features[uVar2] == (HT_Feature *)0x0))
    {
      timeline->features[uVar2] = feature;
      HVar3 = HT_ERR_OK;
    }
    else {
      (*pHVar1->destroy)(feature);
    }
    return HVar3;
  }
  __assert_fail("feature->klass",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                ,0x7c,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
}

Assistant:

HT_ErrorCode
ht_timeline_set_feature(HT_Timeline* timeline, HT_Feature* feature)
{
    assert(feature);
    assert(feature->klass);

    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature->klass->id == HT_INVALID_FEATURE_ID || feature->klass->id >= HT_TIMELINE_MAX_FEATURES)
    {
        error_code = HT_ERR_FEATURE_NOT_REGISTERED;
    }
    else if (timeline->features[feature->klass->id])
    {
        error_code = HT_ERR_FEATURE_ALREADY_REGISTERED;
    }
    else
    {
        timeline->features[feature->klass->id] = feature;
    }

    if (error_code != HT_ERR_OK)
    {
        feature->klass->destroy(feature);
    }

    return error_code;
}